

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  int iVar1;
  Expr *pA;
  ExprList_item *pEVar2;
  
  iVar1 = sqlite3ExprCompare(pParse,pE1,pE2,iTab);
  if (iVar1 == 0) {
    return 1;
  }
  if (pE2->op == 'F') {
    iVar1 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pLeft,iTab);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pRight,iTab);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (((pE2->op == 'L') && (pE1->op != 'H')) && (pE1->op != 'K')) {
    pA = pE1->pLeft;
    while ((pA != (Expr *)0x0 && ((pA->flags >> 0xc & 1) != 0))) {
      if ((pA->flags >> 0x12 & 1) == 0) {
        pEVar2 = (ExprList_item *)&pA->pLeft;
      }
      else {
        pEVar2 = ((pA->x).pList)->a;
      }
      pA = pEVar2->pExpr;
    }
    iVar1 = sqlite3ExprCompare(pParse,pA,pE2->pLeft,iTab);
    if (iVar1 == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(Parse *pParse, Expr *pE1, Expr *pE2, int iTab){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL && pE1->op!=TK_ISNULL && pE1->op!=TK_IS ){
    Expr *pX = sqlite3ExprSkipCollate(pE1->pLeft);
    testcase( pX!=pE1->pLeft );
    if( sqlite3ExprCompare(pParse, pX, pE2->pLeft, iTab)==0 ) return 1;
  }
  return 0;
}